

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmPageTableMgr.cpp
# Opt level: O2

int __thiscall
GmmLib::GmmPageTableMgr::GetPageTableBOList(GmmPageTableMgr *this,uint8_t TTFlags,void *BOList)

{
  HANDLE pvVar1;
  int i;
  int iVar2;
  int iVar3;
  ulong uVar4;
  GMM_PAGETABLEPool *pGVar5;
  undefined3 in_register_00000031;
  
  iVar2 = (*this->_vptr_GmmPageTableMgr[5])();
  iVar3 = 0;
  if (iVar2 != 0 && (BOList != (void *)0x0 && CONCAT31(in_register_00000031,TTFlags) != 0)) {
    if (this->AuxTTObj != (AuxTable *)0x0) {
      pthread_mutex_lock((pthread_mutex_t *)&this->PoolLock);
      if ((this->AuxTTObj != (AuxTable *)0x0) &&
         (pvVar1 = (this->AuxTTObj->super_PageTable).TTL3.L3Handle, pvVar1 != (HANDLE)0x0)) {
        *(HANDLE *)BOList = pvVar1;
      }
    }
    pGVar5 = this->pPool;
    for (uVar4 = 0; uVar4 < this->NumNodePoolElements; uVar4 = uVar4 + 1) {
      if (pGVar5 == (GMM_PAGETABLEPool *)0x0) {
        pGVar5 = (GmmPageTablePool *)0x0;
      }
      else {
        *(HANDLE *)((long)BOList + uVar4 * 8 + 8) = pGVar5->PoolHandle;
        pGVar5 = pGVar5->NextPool;
      }
    }
    iVar3 = iVar2;
    if (this->AuxTTObj != (AuxTable *)0x0) {
      pthread_mutex_unlock((pthread_mutex_t *)&this->PoolLock);
    }
  }
  return iVar3;
}

Assistant:

int GmmLib::GmmPageTableMgr::GetPageTableBOList(uint8_t TTFlags, void *BOList)
{
    int                        NumBO   = GetNumOfPageTableBOs(TTFlags);
    HANDLE *                   Handles = (HANDLE *)BOList;
    GmmLib::GMM_PAGETABLEPool *Pool;

    __GMM_ASSERTPTR(TTFlags & AUXTT, 0);
    __GMM_ASSERTPTR(BOList, 0);
    __GMM_ASSERTPTR(NumBO, 0);

    ENTER_CRITICAL_SECTION

    if(AuxTTObj && AuxTTObj->GetL3Handle())
        Handles[0] = AuxTTObj->GetL3Handle();

    Pool = pPool;

    for(int i = 0; i < NumNodePoolElements; i++)
    {
        if(Pool)
        {
            Handles[i + 1] = Pool->GetPoolHandle();
            Pool           = Pool->GetNextPool();
        }
    }

    EXIT_CRITICAL_SECTION

    return NumBO;
}